

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hash.h
# Opt level: O0

void __thiscall
tsl::detail_robin_hash::
robin_hash<std::pair<unsigned_long,_ImputedData<long,_double>_>,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
::robin_hash(robin_hash<std::pair<unsigned_long,_ImputedData<long,_double>_>,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
             *this,size_type bucket_count,hash<unsigned_long> *hash,equal_to<unsigned_long> *equal,
            allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_> *alloc,
            float min_load_factor,float max_load_factor)

{
  bool bVar1;
  undefined8 *puVar2;
  bucket_entry<std::pair<unsigned_long,_ImputedData<long,_double>_>,_false> *pbVar3;
  robin_hash<std::pair<unsigned_long,_ImputedData<long,_double>_>,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
  *this_00;
  length_error *this_01;
  reference this_02;
  robin_hash<std::pair<unsigned_long,_ImputedData<long,_double>_>,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
  *in_RSI;
  long in_RDI;
  allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_> *in_stack_ffffffffffffff68;
  allocator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_ImputedData<long,_double>_>,_false>_>
  *in_stack_ffffffffffffff70;
  float ml;
  robin_hash<std::pair<unsigned_long,_ImputedData<long,_double>_>,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
  *in_stack_ffffffffffffff80;
  size_t *in_stack_ffffffffffffff88;
  vector<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_ImputedData<long,_double>_>,_false>,_std::allocator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_ImputedData<long,_double>_>,_false>_>_>
  *in_stack_ffffffffffffff90;
  
  rh::power_of_two_growth_policy<2UL>::power_of_two_growth_policy
            ((power_of_two_growth_policy<2UL> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88)
  ;
  std::
  allocator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,ImputedData<long,double>>,false>>
  ::allocator<std::pair<unsigned_long,ImputedData<long,double>>>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  std::
  vector<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_ImputedData<long,_double>_>,_false>,_std::allocator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_ImputedData<long,_double>_>,_false>_>_>
  ::vector(in_stack_ffffffffffffff90,(size_type)in_stack_ffffffffffffff88,
           (allocator_type *)in_stack_ffffffffffffff80);
  std::
  allocator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_ImputedData<long,_double>_>,_false>_>
  ::~allocator((allocator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_ImputedData<long,_double>_>,_false>_>
                *)0x3241be);
  puVar2 = (undefined8 *)(in_RDI + 0x20);
  bVar1 = std::
          vector<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_ImputedData<long,_double>_>,_false>,_std::allocator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_ImputedData<long,_double>_>,_false>_>_>
          ::empty((vector<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_ImputedData<long,_double>_>,_false>,_std::allocator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_ImputedData<long,_double>_>,_false>_>_>
                   *)in_stack_ffffffffffffff80);
  if (bVar1) {
    pbVar3 = static_empty_bucket_ptr
                       ((robin_hash<std::pair<unsigned_long,_ImputedData<long,_double>_>,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                         *)0x3241e8);
  }
  else {
    pbVar3 = std::
             vector<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_ImputedData<long,_double>_>,_false>,_std::allocator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_ImputedData<long,_double>_>,_false>_>_>
             ::data((vector<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_ImputedData<long,_double>_>,_false>,_std::allocator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_ImputedData<long,_double>_>,_false>_>_>
                     *)0x3241fd);
  }
  *puVar2 = pbVar3;
  *(robin_hash<std::pair<unsigned_long,_ImputedData<long,_double>_>,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
    **)(in_RDI + 0x28) = in_RSI;
  *(undefined8 *)(in_RDI + 0x30) = 0;
  *(undefined1 *)(in_RDI + 0x48) = 0;
  *(undefined1 *)(in_RDI + 0x49) = 0;
  this_00 = (robin_hash<std::pair<unsigned_long,_ImputedData<long,_double>_>,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
             *)max_bucket_count(in_stack_ffffffffffffff80);
  if (this_00 < in_RSI) {
    this_01 = (length_error *)__cxa_allocate_exception(0x10);
    std::length_error::length_error(this_01,"The map exceeds its maximum bucket count.");
    __cxa_throw(this_01,&std::length_error::typeinfo,std::length_error::~length_error);
  }
  if (*(long *)(in_RDI + 0x28) != 0) {
    this_02 = std::
              vector<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_ImputedData<long,_double>_>,_false>,_std::allocator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_ImputedData<long,_double>_>,_false>_>_>
              ::back((vector<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_ImputedData<long,_double>_>,_false>,_std::allocator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_ImputedData<long,_double>_>,_false>_>_>
                      *)in_stack_ffffffffffffff70);
    bucket_entry<std::pair<unsigned_long,_ImputedData<long,_double>_>,_false>::set_as_last_bucket
              (this_02);
  }
  ml = (float)((ulong)in_RSI >> 0x20);
  robin_hash<std::pair<unsigned_long,_ImputedData<long,_double>_>,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
  ::min_load_factor(this_00,ml);
  robin_hash<std::pair<unsigned_long,_ImputedData<long,_double>_>,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_ImputedData<long,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
  ::max_load_factor(this_00,ml);
  return;
}

Assistant:

robin_hash(size_type bucket_count, const Hash& hash, const KeyEqual& equal,
             const Allocator& alloc,
             float min_load_factor = DEFAULT_MIN_LOAD_FACTOR,
             float max_load_factor = DEFAULT_MAX_LOAD_FACTOR)
      : Hash(hash),
        KeyEqual(equal),
        GrowthPolicy(bucket_count),
        m_buckets_data(bucket_count, alloc),
        m_buckets(m_buckets_data.empty() ? static_empty_bucket_ptr()
                                         : m_buckets_data.data()),
        m_bucket_count(bucket_count),
        m_nb_elements(0),
        m_grow_on_next_insert(false),
        m_try_shrink_on_next_insert(false) {
    if (bucket_count > max_bucket_count()) {
      TSL_RH_THROW_OR_TERMINATE(std::length_error,
                                "The map exceeds its maximum bucket count.");
    }

    if (m_bucket_count > 0) {
      tsl_rh_assert(!m_buckets_data.empty());
      m_buckets_data.back().set_as_last_bucket();
    }

    this->min_load_factor(min_load_factor);
    this->max_load_factor(max_load_factor);
  }